

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3DoclistNext
               (int bDescIdx,char *aDoclist,int nDoclist,char **ppIter,sqlite3_int64 *piDocid,
               u8 *pbEof)

{
  int iVar1;
  bool bVar2;
  long local_48;
  sqlite3_int64 iVar;
  char *p;
  u8 *pbEof_local;
  sqlite3_int64 *piDocid_local;
  char **ppIter_local;
  char *pcStack_18;
  int nDoclist_local;
  char *aDoclist_local;
  int bDescIdx_local;
  
  iVar = (sqlite3_int64)*ppIter;
  p = (char *)pbEof;
  pbEof_local = (u8 *)piDocid;
  piDocid_local = (sqlite3_int64 *)ppIter;
  ppIter_local._4_4_ = nDoclist;
  pcStack_18 = aDoclist;
  aDoclist_local._4_4_ = bDescIdx;
  if ((char *)iVar == (char *)0x0) {
    iVar = (sqlite3_int64)aDoclist;
    iVar1 = sqlite3Fts3GetVarint(aDoclist,piDocid);
    iVar = iVar + iVar1;
  }
  else {
    fts3PoslistCopy((char **)0x0,(char **)&iVar);
    while( true ) {
      bVar2 = false;
      if ((ulong)iVar < pcStack_18 + ppIter_local._4_4_) {
        bVar2 = *(char *)iVar == '\0';
      }
      if (!bVar2) break;
      iVar = iVar + 1;
    }
    if ((ulong)iVar < pcStack_18 + ppIter_local._4_4_) {
      iVar1 = sqlite3Fts3GetVarint((char *)iVar,&local_48);
      iVar = iVar + iVar1;
      iVar1 = 1;
      if (aDoclist_local._4_4_ != 0) {
        iVar1 = -1;
      }
      *(long *)pbEof_local = iVar1 * local_48 + *(long *)pbEof_local;
    }
    else {
      *p = '\x01';
    }
  }
  *piDocid_local = iVar;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3DoclistNext(
  int bDescIdx,                   /* True if the doclist is desc */
  char *aDoclist,                 /* Pointer to entire doclist */
  int nDoclist,                   /* Length of aDoclist in bytes */
  char **ppIter,                  /* IN/OUT: Iterator pointer */
  sqlite3_int64 *piDocid,         /* IN/OUT: Docid pointer */
  u8 *pbEof                       /* OUT: End-of-file flag */
){
  char *p = *ppIter;

  assert( nDoclist>0 );
  assert( *pbEof==0 );
  assert( p || *piDocid==0 );
  assert( !p || (p>=aDoclist && p<=&aDoclist[nDoclist]) );

  if( p==0 ){
    p = aDoclist;
    p += sqlite3Fts3GetVarint(p, piDocid);
  }else{
    fts3PoslistCopy(0, &p);
    while( p<&aDoclist[nDoclist] && *p==0 ) p++; 
    if( p>=&aDoclist[nDoclist] ){
      *pbEof = 1;
    }else{
      sqlite3_int64 iVar;
      p += sqlite3Fts3GetVarint(p, &iVar);
      *piDocid += ((bDescIdx ? -1 : 1) * iVar);
    }
  }

  *ppIter = p;
}